

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O3

int arkStep_NlsLSolve(N_Vector b,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  int nonlin_iter;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int local_1c;
  ARKodeARKStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkStep_AccessARKODEStepMem(arkode_mem,"arkStep_NlsLSolve",&local_10,&local_18);
  if (iVar1 == 0) {
    iVar2 = SUNNonlinSolGetCurIter(local_18->NLS,&local_1c);
    iVar1 = -0x20;
    if (iVar2 == 0) {
      iVar1 = (*local_18->lsolve)(local_10,b,local_10->tcur,local_10->ycur,
                                  local_18->Fi[local_18->istage],local_18->eRNrm,local_1c);
      if (iVar1 < 0) {
        iVar1 = -7;
      }
      else {
        iVar1 = (uint)(iVar1 != 0) << 2;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsLSolve(N_Vector b, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval, nonlin_iter;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* retrieve nonlinear solver iteration from module */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nonlin_iter);
  if (retval != SUN_SUCCESS) { return (ARK_NLS_OP_ERR); }

  /* call linear solver interface, and handle return value */
  retval = step_mem->lsolve(ark_mem, b, ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage], step_mem->eRNrm,
                            nonlin_iter);

  if (retval < 0) { return (ARK_LSOLVE_FAIL); }
  if (retval > 0) { return (CONV_FAIL); }

  return (ARK_SUCCESS);
}